

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testNNValidatorLoop(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar5;
  NeuralNetworkLayer *this_00;
  InnerProductLayerParams *pIVar6;
  NeuralNetworkLayer *this_01;
  NeuralNetworkLayer *this_02;
  ostream *poVar7;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_03;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"A");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"B");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pNVar5 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  this_03 = &pNVar5->layers_;
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (this_03);
  pIVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this_00);
  CoreML::Specification::NeuralNetworkLayer::set_name(this_00,"ip1");
  pIVar6->hasbias_ = false;
  this_01 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (this_03);
  pIVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this_01);
  pIVar6->hasbias_ = false;
  CoreML::Specification::NeuralNetworkLayer::set_name(this_01,"ip2");
  this_02 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (this_03);
  pIVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this_02);
  pIVar6->hasbias_ = false;
  CoreML::Specification::NeuralNetworkLayer::set_name(this_02,"ip3");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"B");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"C");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_02,"C");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_02,"A");
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x229);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"!((res).good())");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar1;
}

Assistant:

int testNNValidatorLoop() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *ip1 = nn->add_layers();
    Specification::InnerProductLayerParams *innerProductParams1 = ip1->mutable_innerproduct();
    ip1->set_name("ip1");

    innerProductParams1->set_hasbias(false);

    Specification::NeuralNetworkLayer *ip2 = nn->add_layers();
    Specification::InnerProductLayerParams *innerProductParams2 = ip2->mutable_innerproduct();

    innerProductParams2->set_hasbias(false);

    ip2->set_name("ip2");

    Specification::NeuralNetworkLayer *ip3 = nn->add_layers();
    Specification::InnerProductLayerParams *innerProductParams3 = ip3->mutable_innerproduct();

    innerProductParams3->set_hasbias(false);
    ip3->set_name("ip3");

    // Make a loop

    ip1->add_input("A");
    ip1->add_output("B");

    ip2->add_input("B");
    ip2->add_output("C");

    ip3->add_input("C");
    ip3->add_output("A");

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;
}